

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

LBBox3fa * __thiscall embree::SceneGraph::Node::lbounds(Node *this)

{
  LBBox3fa *in_RDI;
  
  *(undefined8 *)&(in_RDI->bounds0).lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(in_RDI->bounds0).lower.field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)&(in_RDI->bounds0).upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(in_RDI->bounds0).upper.field_0 + 8) = 0xff800000ff800000;
  *(undefined8 *)&(in_RDI->bounds1).lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(in_RDI->bounds1).lower.field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)&(in_RDI->bounds1).upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(in_RDI->bounds1).upper.field_0 + 8) = 0xff800000ff800000;
  return in_RDI;
}

Assistant:

virtual LBBox3fa lbounds() const {
        return empty;
      }